

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O0

void __thiscall
RegisterBuildTestPhonyNoWork::RegisterBuildTestPhonyNoWork(RegisterBuildTestPhonyNoWork *this)

{
  RegisterBuildTestPhonyNoWork *this_local;
  
  RegisterTest(BuildTestPhonyNoWork::Create,"BuildTest.PhonyNoWork");
  return;
}

Assistant:

TEST_F(BuildTest, PhonyNoWork) {
  string err;
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"build out: cat bar.cc\n"
"build all: phony out\n"));
  fs_.Create("bar.cc", "");
  fs_.Create("out", "");

  EXPECT_TRUE(builder_.AddTarget("all", &err));
  ASSERT_EQ("", err);
  EXPECT_TRUE(builder_.AlreadyUpToDate());
}